

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAsyncWorker.hpp
# Opt level: O3

void __thiscall sftm::CAsyncWorker::ThreadFunc(CAsyncWorker *this)

{
  __int_type_conflict _Var1;
  CConcurrentPtrQueue<sftm::CAsyncTask> *pCVar2;
  CAsyncTask *pCVar3;
  uint uVar4;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_20;
  
  if (this->m_bStopping == false) {
    do {
      pCVar2 = (this->m_ownerData).m_pTaskQueue;
      if (pCVar2->m_nCount != 0) {
        while( true ) {
          LOCK();
          _Var1 = (pCVar2->m_lock).m_bLock._M_base._M_i;
          (pCVar2->m_lock).m_bLock._M_base._M_i = true;
          UNLOCK();
          if ((_Var1 & 1U) == 0) break;
          do {
          } while (((pCVar2->m_lock).m_bLock._M_base._M_i & 1U) != 0);
        }
        if (pCVar2->m_nCount == 0) {
          (pCVar2->m_lock).m_bLock._M_base._M_i = false;
        }
        else {
          uVar4 = pCVar2->m_nCount - 1;
          pCVar3 = pCVar2->m_pItems[uVar4];
          pCVar2->m_nCount = uVar4;
          (pCVar2->m_lock).m_bLock._M_base._M_i = false;
          if (pCVar3 != (CAsyncTask *)0x0) {
            (*pCVar3->_vptr_CAsyncTask[2])();
          }
        }
      }
      local_20._M_device = (this->m_ownerData).m_pMutWorkerIdle;
      local_20._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_20);
      local_20._M_owns = true;
      std::condition_variable::wait((unique_lock *)(this->m_ownerData).m_pCvWorkerIdle);
      std::unique_lock<std::mutex>::~unique_lock(&local_20);
    } while (this->m_bStopping != true);
  }
  this->m_bFinished = true;
  return;
}

Assistant:

void ThreadFunc() noexcept
		{
			while (!m_bStopping)
			{
				CAsyncTask* pTask = m_ownerData.m_pTaskQueue->Pop();
				if (pTask)
					pTask->Execute();

				std::unique_lock<std::mutex> lock(*m_ownerData.m_pMutWorkerIdle);
				m_ownerData.m_pCvWorkerIdle->wait(lock);
			}

			m_bFinished = true;
		}